

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void run_container_intersection(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  bool bVar1;
  byte bVar2;
  _Bool _Var3;
  int iVar4;
  int *in_RDX;
  run_container_t *in_RSI;
  run_container_t *in_RDI;
  int32_t earliestend;
  int32_t lateststart;
  int32_t xend;
  int32_t xstart;
  int32_t end;
  int32_t start;
  int32_t xrlepos;
  int32_t rlepos;
  int32_t neededcapacity;
  _Bool if2;
  _Bool if1;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 copy;
  int iVar7;
  int32_t in_stack_ffffffffffffffdc;
  undefined2 in_stack_ffffffffffffffe4;
  
  copy = (undefined1)((uint)in_stack_ffffffffffffffd8 >> 0x18);
  bVar2 = run_container_is_full(in_RDI);
  _Var3 = run_container_is_full(in_RSI);
  if (((bVar2 & 1) != 0) || (_Var3)) {
    if ((bVar2 & 1) != 0) {
      run_container_copy((run_container_t *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         (run_container_t *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      return;
    }
    if (_Var3) {
      run_container_copy((run_container_t *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         (run_container_t *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      return;
    }
  }
  iVar4 = in_RDI->n_runs + in_RSI->n_runs;
  if (in_RDX[1] < iVar4) {
    run_container_grow((run_container_t *)
                       CONCAT17(bVar2,CONCAT16(_Var3,CONCAT24(in_stack_ffffffffffffffe4,iVar4))),
                       in_stack_ffffffffffffffdc,(_Bool)copy);
  }
  *in_RDX = 0;
  iVar4 = 0;
  iVar7 = 0;
  local_2c = (uint)in_RDI->runs->value;
  local_30 = local_2c + in_RDI->runs->length + 1;
  local_34 = (uint)in_RSI->runs->value;
  local_38 = local_34 + in_RSI->runs->length + 1;
  while( true ) {
    uVar6 = local_30;
    bVar1 = false;
    if (iVar4 < in_RDI->n_runs) {
      bVar1 = iVar7 < in_RSI->n_runs;
    }
    if (!bVar1) break;
    if (local_34 < local_30) {
      if (local_2c < local_38) {
        uVar5 = local_34;
        if (local_34 < local_2c) {
          uVar5 = local_2c;
        }
        if (local_30 == local_38) {
          iVar4 = iVar4 + 1;
          iVar7 = iVar7 + 1;
          if (iVar4 < in_RDI->n_runs) {
            local_2c = (uint)in_RDI->runs[iVar4].value;
            local_30 = local_2c + in_RDI->runs[iVar4].length + 1;
          }
          if (iVar7 < in_RSI->n_runs) {
            local_34 = (uint)in_RSI->runs[iVar7].value;
            local_38 = local_34 + in_RSI->runs[iVar7].length + 1;
          }
        }
        else if (local_30 < local_38) {
          iVar4 = iVar4 + 1;
          if (iVar4 < in_RDI->n_runs) {
            local_2c = (uint)in_RDI->runs[iVar4].value;
            local_30 = local_2c + in_RDI->runs[iVar4].length + 1;
          }
        }
        else {
          iVar7 = iVar7 + 1;
          uVar6 = local_38;
          if (iVar7 < in_RSI->n_runs) {
            local_34 = (uint)in_RSI->runs[iVar7].value;
            local_38 = local_34 + in_RSI->runs[iVar7].length + 1;
          }
        }
        *(short *)(*(long *)(in_RDX + 2) + (long)*in_RDX * 4) = (short)uVar5;
        *(short *)(*(long *)(in_RDX + 2) + 2 + (long)*in_RDX * 4) =
             ((short)uVar6 - (short)uVar5) + -1;
        *in_RDX = *in_RDX + 1;
      }
      else {
        iVar7 = iVar7 + 1;
        if (iVar7 < in_RSI->n_runs) {
          local_34 = (uint)in_RSI->runs[iVar7].value;
          local_38 = local_34 + in_RSI->runs[iVar7].length + 1;
        }
      }
    }
    else {
      iVar4 = iVar4 + 1;
      if (iVar4 < in_RDI->n_runs) {
        local_2c = (uint)in_RDI->runs[iVar4].value;
        local_30 = local_2c + in_RDI->runs[iVar4].length + 1;
      }
    }
  }
  return;
}

Assistant:

void run_container_intersection(const run_container_t *src_1,
                                const run_container_t *src_2,
                                run_container_t *dst) {
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            run_container_copy(src_2, dst);
            return;
        }
        if (if2) {
            run_container_copy(src_1, dst);
            return;
        }
    }
    // TODO: this could be a lot more efficient, could use SIMD optimizations
    const int32_t neededcapacity = src_1->n_runs + src_2->n_runs;
    if (dst->capacity < neededcapacity)
        run_container_grow(dst, neededcapacity, false);
    dst->n_runs = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;
    int32_t start = src_1->runs[rlepos].value;
    int32_t end = start + src_1->runs[rlepos].length + 1;
    int32_t xstart = src_2->runs[xrlepos].value;
    int32_t xend = xstart + src_2->runs[xrlepos].length + 1;
    while ((rlepos < src_1->n_runs) && (xrlepos < src_2->n_runs)) {
        if (end <= xstart) {
            ++rlepos;
            if (rlepos < src_1->n_runs) {
                start = src_1->runs[rlepos].value;
                end = start + src_1->runs[rlepos].length + 1;
            }
        } else if (xend <= start) {
            ++xrlepos;
            if (xrlepos < src_2->n_runs) {
                xstart = src_2->runs[xrlepos].value;
                xend = xstart + src_2->runs[xrlepos].length + 1;
            }
        } else {  // they overlap
            const int32_t lateststart = start > xstart ? start : xstart;
            int32_t earliestend;
            if (end == xend) {  // improbable
                earliestend = end;
                rlepos++;
                xrlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            } else if (end < xend) {
                earliestend = end;
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }

            } else {  // end > xend
                earliestend = xend;
                xrlepos++;
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            }
            dst->runs[dst->n_runs].value = (uint16_t)lateststart;
            dst->runs[dst->n_runs].length =
                (uint16_t)(earliestend - lateststart - 1);
            dst->n_runs++;
        }
    }
}